

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryLambdaWrapper,bool,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t),false,false>
               (interval_t *ldata,date_t *rdata,date_t *result_data,idx_t count,ValidityMask *mask,
               _func_date_t_interval_t_date_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  date_t dVar8;
  ulong uVar9;
  ulong uVar10;
  idx_t iVar11;
  int64_t *piVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  interval_t iVar16;
  interval_t iVar17;
  interval_t iVar18;
  int64_t *local_78;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &ldata->micros;
      iVar11 = 0;
      do {
        uVar3 = ((interval_t *)(local_78 + -1))->months;
        uVar7 = ((interval_t *)(local_78 + -1))->days;
        iVar18.days = uVar7;
        iVar18.months = uVar3;
        iVar18.micros = *local_78;
        dVar8 = (*fun)(iVar18,rdata[iVar11].days);
        result_data[iVar11].days = dVar8.days;
        iVar11 = iVar11 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar11);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar13 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar4[uVar9];
      }
      uVar10 = uVar13 + 0x40;
      if (count <= uVar13 + 0x40) {
        uVar10 = count;
      }
      uVar14 = uVar10;
      if (uVar15 != 0) {
        uVar14 = uVar13;
        if (uVar15 == 0xffffffffffffffff) {
          if (uVar13 < uVar10) {
            piVar12 = &ldata[uVar13].micros;
            do {
              uVar1 = ((interval_t *)(piVar12 + -1))->months;
              uVar5 = ((interval_t *)(piVar12 + -1))->days;
              iVar16.days = uVar5;
              iVar16.months = uVar1;
              iVar16.micros = *piVar12;
              dVar8 = (*fun)(iVar16,rdata[uVar13].days);
              result_data[uVar13].days = dVar8.days;
              uVar13 = uVar13 + 1;
              piVar12 = piVar12 + 2;
              uVar14 = uVar13;
            } while (uVar10 != uVar13);
          }
        }
        else if (uVar13 < uVar10) {
          piVar12 = &ldata[uVar13].micros;
          uVar14 = 0;
          do {
            if ((uVar15 >> (uVar14 & 0x3f) & 1) != 0) {
              uVar2 = ((interval_t *)(piVar12 + -1))->months;
              uVar6 = ((interval_t *)(piVar12 + -1))->days;
              iVar17.days = uVar6;
              iVar17.months = uVar2;
              iVar17.micros = *piVar12;
              dVar8 = (*fun)(iVar17,rdata[uVar13 + uVar14].days);
              result_data[uVar13 + uVar14].days = dVar8.days;
            }
            uVar14 = uVar14 + 1;
            piVar12 = piVar12 + 2;
          } while ((uVar13 - uVar10) + uVar14 != 0);
          uVar14 = uVar13 + uVar14;
        }
      }
      uVar9 = uVar9 + 1;
      uVar13 = uVar14;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}